

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.h
# Opt level: O2

void __thiscall
cmMakefileProfilingData::RAII::RAII<char_const(&)[8],char_const(&)[9]>
          (RAII *this,cmMakefileProfilingData *data,char (*args) [8],char (*args_1) [9])

{
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  _Optional_payload_base<Json::Value> local_40;
  
  this->Data = data;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,*args,&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,*args_1,&local_82);
  local_40._M_engaged = false;
  StartEntry(data,&local_60,&local_80,(optional<Json::Value> *)&local_40);
  std::_Optional_payload_base<Json::Value>::_M_reset(&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

RAII(cmMakefileProfilingData& data, Args&&... args)
      : Data(&data)
    {
      this->Data->StartEntry(std::forward<Args>(args)...);
    }